

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.cpp
# Opt level: O1

void __thiscall Atari2600::TIA::output_for_cycles(TIA *this,int number_of_cycles)

{
  PlayfieldPriority PVar1;
  ScanTarget *pSVar2;
  uint16_t *puVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  undefined4 extraout_var;
  int iVar7;
  int iVar8;
  size_t number_of_samples;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  
  uVar13 = this->horizontal_counter_;
  uVar15 = (ulong)uVar13;
  iVar9 = number_of_cycles + uVar13;
  this->horizontal_counter_ = iVar9;
  bVar4 = (int)uVar13 < 0xe0;
  if (uVar13 == 0) {
    memset(this->collision_buffer_,0,0xa0);
    (this->ball_).super_HorizontalRun.super_Object<Atari2600::TIA::HorizontalRun>.motion_time =
         (this->ball_).super_HorizontalRun.super_Object<Atari2600::TIA::HorizontalRun>.motion_time %
         0xe4;
    this->player_[0].super_Object<Atari2600::TIA::Player>.motion_time =
         this->player_[0].super_Object<Atari2600::TIA::Player>.motion_time % 0xe4;
    this->player_[1].super_Object<Atari2600::TIA::Player>.motion_time =
         this->player_[1].super_Object<Atari2600::TIA::Player>.motion_time % 0xe4;
    this->missile_[0].super_HorizontalRun.super_Object<Atari2600::TIA::HorizontalRun>.motion_time =
         this->missile_[0].super_HorizontalRun.super_Object<Atari2600::TIA::HorizontalRun>.
         motion_time % 0xe4;
    this->missile_[1].super_HorizontalRun.super_Object<Atari2600::TIA::HorizontalRun>.motion_time =
         this->missile_[1].super_HorizontalRun.super_Object<Atari2600::TIA::HorizontalRun>.
         motion_time % 0xe4;
  }
  if (0x3f < iVar9) {
    uVar5 = 0x40;
    if (0x40 < (int)uVar13) {
      uVar5 = uVar13;
    }
    iVar14 = 0xe0;
    if (iVar9 < 0xe0) {
      iVar14 = iVar9;
    }
    uVar5 = uVar5 + 7 & 0x7ffffffc;
    if ((int)uVar5 < (int)(iVar14 + 4U)) {
      uVar6 = (ulong)uVar5;
      do {
        iVar7 = (int)uVar6 + -0x44 >> 2;
        uVar5 = 0x1010101;
        if ((this->background_[this->background_half_mask_ & iVar7 / 0x14] >> (iVar7 % 0x14 & 0x1fU)
            & 1) == 0) {
          uVar5 = 0;
        }
        *(uint *)(this->collision_buffer_ + (uVar6 - 0x44)) =
             *(uint *)(this->collision_buffer_ + (uVar6 - 0x44)) | uVar5;
        uVar6 = uVar6 + 4;
      } while (uVar6 < iVar14 + 4U);
    }
  }
  draw_object<Atari2600::TIA::Player>(this,this->player_,'\x04',uVar13,this->horizontal_counter_);
  draw_object<Atari2600::TIA::Player>(this,this->player_ + 1,'\b',uVar13,this->horizontal_counter_);
  draw_missile(this,this->missile_,this->player_,'\x10',uVar13,this->horizontal_counter_);
  draw_missile(this,this->missile_ + 1,this->player_ + 1,' ',uVar13,this->horizontal_counter_);
  draw_object<Atari2600::TIA::Ball>(this,&this->ball_,'\x02',uVar13,this->horizontal_counter_);
  if ((this->output_mode_ | 2U) == 3) {
    if ((int)uVar13 < 0x10) {
      iVar14 = this->horizontal_counter_;
      if (0x10 < iVar14) {
        Outputs::CRT::CRT::output_sync(&this->crt_,uVar13 * -2 + 0x20);
        uVar15 = 0x10;
        goto LAB_00300397;
      }
LAB_00300470:
      Outputs::CRT::CRT::output_sync(&this->crt_,(iVar14 - uVar13) * 2);
      goto LAB_00300918;
    }
LAB_00300397:
    uVar13 = (uint)uVar15;
    if (uVar13 < 0x20) {
      iVar14 = this->horizontal_counter_;
      if (iVar14 < 0x21) goto LAB_003004f2;
      Outputs::CRT::CRT::output_blank(&this->crt_,uVar13 * -2 + 0x40);
      uVar15 = 0x20;
    }
    iVar14 = (int)uVar15;
    if (iVar14 < 0x30) {
      iVar7 = this->horizontal_counter_;
      if (iVar7 < 0x31) goto LAB_003004ac;
      Outputs::CRT::CRT::output_default_colour_burst(&this->crt_,iVar14 * -2 + 0x60,')');
      uVar15 = 0x30;
    }
    uVar13 = (uint)uVar15;
    if (uVar13 < 0xe4) {
      iVar14 = this->horizontal_counter_;
      if (iVar14 < 0xe5) goto LAB_00300470;
      Outputs::CRT::CRT::output_sync(&this->crt_,uVar13 * -2 + 0x1c8);
      uVar15 = 0xe4;
    }
  }
  else {
    if ((int)uVar13 < 0x10) {
      iVar14 = this->horizontal_counter_;
      if (0x10 < iVar14) {
        Outputs::CRT::CRT::output_blank(&this->crt_,uVar13 * -2 + 0x20);
        uVar15 = 0x10;
        goto LAB_0030045f;
      }
LAB_003004f2:
      Outputs::CRT::CRT::output_blank(&this->crt_,(iVar14 - uVar13) * 2);
      goto LAB_00300918;
    }
LAB_0030045f:
    uVar13 = (uint)uVar15;
    if (uVar13 < 0x20) {
      iVar14 = this->horizontal_counter_;
      if (iVar14 < 0x21) goto LAB_00300470;
      Outputs::CRT::CRT::output_sync(&this->crt_,uVar13 * -2 + 0x40);
      uVar15 = 0x20;
    }
    iVar14 = (int)uVar15;
    if (iVar14 < 0x30) {
      iVar7 = this->horizontal_counter_;
      if (0x30 < iVar7) {
        Outputs::CRT::CRT::output_default_colour_burst(&this->crt_,iVar14 * -2 + 0x60,')');
        uVar15 = 0x30;
        goto LAB_003004e1;
      }
LAB_003004ac:
      Outputs::CRT::CRT::output_default_colour_burst(&this->crt_,(iVar7 - iVar14) * 2,')');
      goto LAB_00300918;
    }
LAB_003004e1:
    uVar13 = (uint)uVar15;
    if (uVar13 < 0x44) {
      iVar14 = this->horizontal_counter_;
      if (iVar14 < 0x45) goto LAB_003004f2;
      Outputs::CRT::CRT::output_blank(&this->crt_,uVar13 * -2 + 0x88);
      uVar15 = 0x44;
    }
  }
  iVar14 = (int)uVar15;
  if ((this->output_mode_ & 2) == 0) {
    if (this->pixels_start_location_ == 0) {
      this->pixels_start_location_ = iVar14;
      pSVar2 = (this->crt_).scan_target_;
      iVar7 = (*pSVar2->_vptr_ScanTarget[5])(pSVar2,0xa0,1);
      (this->crt_).allocated_data_length_ =
           -(ulong)((uint16_t *)CONCAT44(extraout_var,iVar7) == (uint16_t *)0x0) | 0xa0;
      this->pixel_target_ = (uint16_t *)CONCAT44(extraout_var,iVar7);
    }
    puVar3 = this->pixel_target_;
    if (puVar3 != (uint16_t *)0x0) {
      iVar7 = this->pixels_start_location_;
      iVar11 = iVar14;
      if (iVar14 < iVar7) {
        iVar11 = iVar7;
      }
      iVar8 = this->horizontal_counter_;
      iVar7 = iVar11 - iVar7;
      if ((iVar11 < 0x4c) && (this->horizontal_blank_extend_ == true)) {
        iVar10 = 0x4c;
        if (iVar8 < 0x4c) {
          iVar10 = iVar8;
        }
        if (iVar11 < iVar10) {
          lVar12 = 0;
          do {
            puVar3[iVar7 + lVar12] = 0xff00;
            lVar12 = lVar12 + 1;
          } while (iVar10 - iVar11 != (int)lVar12);
          iVar7 = iVar7 + (int)lVar12;
          iVar11 = iVar10;
        }
      }
      PVar1 = this->playfield_priority_;
      if (PVar1 == Score) {
        iVar10 = 0x94;
        if (iVar8 < 0x94) {
          iVar10 = iVar8;
        }
        if (iVar11 < iVar10) {
          lVar12 = 0;
          do {
            puVar3[iVar7 + lVar12] =
                 (this->colour_palette_)._M_elems
                 [this->colour_mask_by_mode_collision_flags_[1]
                  [this->collision_buffer_[lVar12 + iVar11 + -0x44]]].luminance_phase;
            lVar12 = lVar12 + 1;
          } while ((long)iVar10 - (long)iVar11 != lVar12);
          iVar11 = iVar11 + (int)lVar12;
          iVar7 = iVar7 + (int)lVar12;
        }
        if (iVar11 < iVar8) {
          lVar12 = 0;
          do {
            puVar3[iVar7 + lVar12] =
                 (this->colour_palette_)._M_elems
                 [this->colour_mask_by_mode_collision_flags_[2]
                  [this->collision_buffer_[lVar12 + iVar11 + -0x44]]].luminance_phase;
            lVar12 = lVar12 + 1;
          } while ((long)iVar8 - (long)iVar11 != lVar12);
        }
      }
      else if (iVar11 < iVar8) {
        lVar12 = 0;
        do {
          puVar3[iVar7 + lVar12] =
               (this->colour_palette_)._M_elems
               [this->colour_mask_by_mode_collision_flags_[0]
                [(ulong)this->collision_buffer_[lVar12 + iVar11 + -0x44] +
                 (ulong)((uint)(PVar1 != Standard) * 0xc0)]].luminance_phase;
          lVar12 = lVar12 + 1;
        } while ((long)iVar8 - (long)iVar11 != lVar12);
      }
    }
    uVar13 = this->horizontal_counter_;
    if (iVar14 < (int)uVar13) {
      uVar5 = this->collision_flags_;
      do {
        uVar5 = uVar5 | this->collision_flags_by_buffer_vaules_
                        [this->collision_buffer_[uVar15 - 0x44]];
        this->collision_flags_ = uVar5;
        uVar15 = uVar15 + 1;
      } while (uVar13 != uVar15);
    }
    if (uVar13 == 0xe4) {
      number_of_samples = (long)(int)uVar15 - (long)this->pixels_start_location_;
      Outputs::CRT::CRT::output_data(&this->crt_,(int)number_of_samples * 2,number_of_samples);
      this->pixel_target_ = (uint16_t *)0x0;
      this->pixels_start_location_ = 0;
    }
  }
  else {
    puVar3 = this->pixel_target_;
    if (puVar3 != (uint16_t *)0x0) {
      iVar7 = this->pixels_start_location_;
      lVar12 = 0;
      iVar11 = iVar7;
      if ((iVar7 < 0x4c) && (this->horizontal_blank_extend_ == true)) {
        iVar8 = 0x4c;
        if (iVar14 < 0x4c) {
          iVar8 = iVar14;
        }
        if (iVar7 < iVar8) {
          lVar12 = 0;
          do {
            puVar3[lVar12] = 0xff00;
            lVar12 = lVar12 + 1;
            iVar11 = iVar8;
          } while (iVar8 - iVar7 != (int)lVar12);
        }
      }
      PVar1 = this->playfield_priority_;
      iVar8 = (int)lVar12;
      if (PVar1 == Score) {
        iVar10 = 0x94;
        if (iVar14 < 0x94) {
          iVar10 = iVar14;
        }
        if (iVar11 < iVar10) {
          lVar12 = 0;
          do {
            puVar3[iVar8 + lVar12] =
                 (this->colour_palette_)._M_elems
                 [this->colour_mask_by_mode_collision_flags_[1]
                  [this->collision_buffer_[lVar12 + iVar11 + -0x44]]].luminance_phase;
            lVar12 = lVar12 + 1;
          } while ((long)iVar10 - (long)iVar11 != lVar12);
          iVar11 = iVar11 + (int)lVar12;
          iVar8 = iVar8 + (int)lVar12;
        }
        if (iVar11 < iVar14) {
          lVar12 = 0;
          do {
            puVar3[iVar8 + lVar12] =
                 (this->colour_palette_)._M_elems
                 [this->colour_mask_by_mode_collision_flags_[2]
                  [this->collision_buffer_[lVar12 + iVar11 + -0x44]]].luminance_phase;
            lVar12 = lVar12 + 1;
          } while ((long)iVar14 - (long)iVar11 != lVar12);
        }
      }
      else if (iVar11 < iVar14) {
        lVar12 = 0;
        do {
          puVar3[iVar8 + lVar12] =
               (this->colour_palette_)._M_elems
               [this->colour_mask_by_mode_collision_flags_[0]
                [(ulong)this->collision_buffer_[lVar12 + iVar11 + -0x44] +
                 (ulong)((uint)(PVar1 != Standard) * 0xc0)]].luminance_phase;
          lVar12 = lVar12 + 1;
        } while ((long)iVar14 - (long)iVar11 != lVar12);
      }
      Outputs::CRT::CRT::output_data(&this->crt_,(iVar14 - iVar7) * 2,(long)(iVar14 - iVar7));
      this->pixel_target_ = (uint16_t *)0x0;
      this->pixels_start_location_ = 0;
    }
    iVar7 = 0xe4;
    if (this->horizontal_counter_ < 0xe4) {
      iVar7 = this->horizontal_counter_;
    }
    Outputs::CRT::CRT::output_blank(&this->crt_,(iVar7 - iVar14) * 2);
  }
  if (bVar4 && 0xdf < iVar9) {
    this->horizontal_blank_extend_ = false;
  }
LAB_00300918:
  this->horizontal_counter_ = this->horizontal_counter_ % 0xe4;
  return;
}

Assistant:

void TIA::output_for_cycles(int number_of_cycles) {
	/*
		Line timing is oriented around 0 being the start of the right-hand side vertical blank;
		a wsync synchronises the CPU to horizontal_counter_ = 0. All timing below is in terms of the
		NTSC colour clock.

		Therefore, each line is composed of:

			16 cycles:	blank					; -> 16
			16 cycles:	sync					; -> 32
			16 cycles:	colour burst			; -> 48
			20 cycles:	blank					; -> 68
			8 cycles:	blank or pixels, depending on whether the blank extend bit is set
			152 cycles:	pixels
	*/
	int output_cursor = horizontal_counter_;
	horizontal_counter_ += number_of_cycles;
	bool is_reset = output_cursor < 224 && horizontal_counter_ >= 224;

	if(!output_cursor) {
		std::memset(collision_buffer_, 0, sizeof(collision_buffer_));

		ball_.motion_time %= 228;
		player_[0].motion_time %= 228;
		player_[1].motion_time %= 228;
		missile_[0].motion_time %= 228;
		missile_[1].motion_time %= 228;
	}

	// accumulate an OR'd version of the output into the collision buffer
	int latent_start = output_cursor + 4;
	int latent_end = horizontal_counter_ + 4;
	draw_playfield(latent_start, latent_end);
	draw_object<Player>(player_[0], uint8_t(CollisionType::Player0), output_cursor, horizontal_counter_);
	draw_object<Player>(player_[1], uint8_t(CollisionType::Player1), output_cursor, horizontal_counter_);
	draw_missile(missile_[0], player_[0], uint8_t(CollisionType::Missile0), output_cursor, horizontal_counter_);
	draw_missile(missile_[1], player_[1], uint8_t(CollisionType::Missile1), output_cursor, horizontal_counter_);
	draw_object<Ball>(ball_, uint8_t(CollisionType::Ball), output_cursor, horizontal_counter_);

	// convert to television signals

#define Period(function, target)	\
	if(output_cursor < target) { \
		if(horizontal_counter_ <= target) { \
			crt_.function((horizontal_counter_ - output_cursor) * 2); \
			horizontal_counter_ %= cycles_per_line; \
			return; \
		} else { \
			crt_.function((target - output_cursor) * 2); \
			output_cursor = target; \
		} \
	}

	switch(output_mode_) {
		default:
			Period(output_blank, 16)
			Period(output_sync, 32)
			Period(output_default_colour_burst, 48)
			Period(output_blank, 68)
		break;
		case sync_flag:
		case sync_flag | blank_flag:
			Period(output_sync, 16)
			Period(output_blank, 32)
			Period(output_default_colour_burst, 48)
			Period(output_sync, 228)
		break;
	}

#undef Period

	if(output_mode_ & blank_flag) {
		if(pixel_target_) {
			output_pixels(pixels_start_location_, output_cursor);
			const int data_length = int(output_cursor - pixels_start_location_);
			crt_.output_data(data_length * 2, size_t(data_length));
			pixel_target_ = nullptr;
			pixels_start_location_ = 0;
		}
		int duration = std::min(228, horizontal_counter_) - output_cursor;
		crt_.output_blank(duration * 2);
	} else {
		if(!pixels_start_location_) {
			pixels_start_location_ = output_cursor;
			pixel_target_ = reinterpret_cast<uint16_t *>(crt_.begin_data(160));
		}

		// convert that into pixels
		if(pixel_target_) output_pixels(output_cursor, horizontal_counter_);

		// accumulate collision flags
		while(output_cursor < horizontal_counter_) {
			collision_flags_ |= collision_flags_by_buffer_vaules_[collision_buffer_[output_cursor - first_pixel_cycle]];
			output_cursor++;
		}

		if(horizontal_counter_ == cycles_per_line) {
			const int data_length = int(output_cursor - pixels_start_location_);
			crt_.output_data(data_length * 2, size_t(data_length));
			pixel_target_ = nullptr;
			pixels_start_location_ = 0;
		}
	}

	if(is_reset) horizontal_blank_extend_ = false;

	horizontal_counter_ %= cycles_per_line;
}